

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O1

void __thiscall
GeneratorProfile_relationalAndLogicalOperators_Test::TestBody
          (GeneratorProfile_relationalAndLogicalOperators_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  undefined1 uVar3;
  char *pcVar4;
  bool falseValue;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_11;
  GeneratorProfilePtr generatorProfile;
  bool trueValue;
  string value;
  AssertHelper local_90 [15];
  bool local_81;
  long *local_80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  bool local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  libcellml::GeneratorProfile::create((Profile)&local_50);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"value","");
  local_39 = true;
  local_81 = false;
  libcellml::GeneratorProfile::setEqualityString(local_50);
  libcellml::GeneratorProfile::setEqString(local_50);
  libcellml::GeneratorProfile::setNeqString(local_50);
  libcellml::GeneratorProfile::setLtString(local_50);
  libcellml::GeneratorProfile::setLeqString(local_50);
  libcellml::GeneratorProfile::setGtString(local_50);
  libcellml::GeneratorProfile::setGeqString(local_50);
  libcellml::GeneratorProfile::setAndString(local_50);
  libcellml::GeneratorProfile::setOrString(local_50);
  libcellml::GeneratorProfile::setXorString(local_50);
  libcellml::GeneratorProfile::setNotString(local_50);
  libcellml::GeneratorProfile::setHasEqOperator(local_50._0_1_);
  libcellml::GeneratorProfile::setHasNeqOperator(local_50._0_1_);
  libcellml::GeneratorProfile::setHasLtOperator(local_50._0_1_);
  libcellml::GeneratorProfile::setHasLeqOperator(local_50._0_1_);
  libcellml::GeneratorProfile::setHasGtOperator(local_50._0_1_);
  libcellml::GeneratorProfile::setHasGeqOperator(local_50._0_1_);
  libcellml::GeneratorProfile::setHasAndOperator(local_50._0_1_);
  libcellml::GeneratorProfile::setHasOrOperator(local_50._0_1_);
  libcellml::GeneratorProfile::setHasXorOperator(local_50._0_1_);
  libcellml::GeneratorProfile::setHasNotOperator(local_50._0_1_);
  libcellml::GeneratorProfile::equalityString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_80,"value","generatorProfile->equalityString()",&local_38,&local_70)
  ;
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_80._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x261,pcVar4);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
      local_70._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::GeneratorProfile::eqString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_80,"value","generatorProfile->eqString()",&local_38,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_80._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x262,pcVar4);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
      local_70._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::GeneratorProfile::neqString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_80,"value","generatorProfile->neqString()",&local_38,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_80._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x263,pcVar4);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
      local_70._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::GeneratorProfile::ltString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_80,"value","generatorProfile->ltString()",&local_38,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_80._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x264,pcVar4);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
      local_70._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::GeneratorProfile::leqString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_80,"value","generatorProfile->leqString()",&local_38,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_80._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x265,pcVar4);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
      local_70._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::GeneratorProfile::gtString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_80,"value","generatorProfile->gtString()",&local_38,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_80._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x266,pcVar4);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
      local_70._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::GeneratorProfile::geqString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_80,"value","generatorProfile->geqString()",&local_38,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_80._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x267,pcVar4);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
      local_70._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::GeneratorProfile::andString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_80,"value","generatorProfile->andString()",&local_38,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_80._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x268,pcVar4);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
      local_70._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::GeneratorProfile::orString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_80,"value","generatorProfile->orString()",&local_38,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_80._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x269,pcVar4);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
      local_70._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::GeneratorProfile::xorString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_80,"value","generatorProfile->xorString()",&local_38,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_80._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x26a,pcVar4);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
      local_70._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::GeneratorProfile::notString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_80,"value","generatorProfile->notString()",&local_38,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_80._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x26b,pcVar4);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
      local_70._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar3 = libcellml::GeneratorProfile::hasEqOperator();
  local_80 = (long *)CONCAT71(local_80._1_7_,uVar3);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_70,"falseValue","generatorProfile->hasEqOperator()",&local_81,
             (bool *)&local_80);
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x26d,pcVar4);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if (local_80 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
      local_80 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_70._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar3 = libcellml::GeneratorProfile::hasNeqOperator();
  local_80 = (long *)CONCAT71(local_80._1_7_,uVar3);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_70,"falseValue","generatorProfile->hasNeqOperator()",&local_81,
             (bool *)&local_80);
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x26e,pcVar4);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if (local_80 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
      local_80 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_70._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar3 = libcellml::GeneratorProfile::hasLtOperator();
  local_80 = (long *)CONCAT71(local_80._1_7_,uVar3);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_70,"falseValue","generatorProfile->hasLtOperator()",&local_81,
             (bool *)&local_80);
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x26f,pcVar4);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if (local_80 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
      local_80 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_70._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar3 = libcellml::GeneratorProfile::hasLeqOperator();
  local_80 = (long *)CONCAT71(local_80._1_7_,uVar3);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_70,"falseValue","generatorProfile->hasLeqOperator()",&local_81,
             (bool *)&local_80);
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x270,pcVar4);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if (local_80 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
      local_80 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_70._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar3 = libcellml::GeneratorProfile::hasGtOperator();
  local_80 = (long *)CONCAT71(local_80._1_7_,uVar3);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_70,"falseValue","generatorProfile->hasGtOperator()",&local_81,
             (bool *)&local_80);
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x271,pcVar4);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if (local_80 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
      local_80 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_70._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar3 = libcellml::GeneratorProfile::hasGeqOperator();
  local_80 = (long *)CONCAT71(local_80._1_7_,uVar3);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_70,"falseValue","generatorProfile->hasGeqOperator()",&local_81,
             (bool *)&local_80);
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x272,pcVar4);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if (local_80 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
      local_80 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_70._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar3 = libcellml::GeneratorProfile::hasAndOperator();
  local_80 = (long *)CONCAT71(local_80._1_7_,uVar3);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_70,"falseValue","generatorProfile->hasAndOperator()",&local_81,
             (bool *)&local_80);
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x273,pcVar4);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if (local_80 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
      local_80 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_70._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar3 = libcellml::GeneratorProfile::hasOrOperator();
  local_80 = (long *)CONCAT71(local_80._1_7_,uVar3);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_70,"falseValue","generatorProfile->hasOrOperator()",&local_81,
             (bool *)&local_80);
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x274,pcVar4);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if (local_80 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
      local_80 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_70._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar3 = libcellml::GeneratorProfile::hasXorOperator();
  local_80 = (long *)CONCAT71(local_80._1_7_,uVar3);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_70,"trueValue","generatorProfile->hasXorOperator()",&local_39,
             (bool *)&local_80);
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x275,pcVar4);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if (local_80 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
      local_80 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_70._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar3 = libcellml::GeneratorProfile::hasNotOperator();
  local_80 = (long *)CONCAT71(local_80._1_7_,uVar3);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_70,"falseValue","generatorProfile->hasNotOperator()",&local_81,
             (bool *)&local_80);
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x276,pcVar4);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if (local_80 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
      local_80 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_70._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  return;
}

Assistant:

TEST(GeneratorProfile, relationalAndLogicalOperators)
{
    libcellml::GeneratorProfilePtr generatorProfile = libcellml::GeneratorProfile::create();

    const std::string value = "value";
    const bool trueValue = true;
    const bool falseValue = false;

    generatorProfile->setEqualityString(value);
    generatorProfile->setEqString(value);
    generatorProfile->setNeqString(value);
    generatorProfile->setLtString(value);
    generatorProfile->setLeqString(value);
    generatorProfile->setGtString(value);
    generatorProfile->setGeqString(value);
    generatorProfile->setAndString(value);
    generatorProfile->setOrString(value);
    generatorProfile->setXorString(value);
    generatorProfile->setNotString(value);

    generatorProfile->setHasEqOperator(falseValue);
    generatorProfile->setHasNeqOperator(falseValue);
    generatorProfile->setHasLtOperator(falseValue);
    generatorProfile->setHasLeqOperator(falseValue);
    generatorProfile->setHasGtOperator(falseValue);
    generatorProfile->setHasGeqOperator(falseValue);
    generatorProfile->setHasAndOperator(falseValue);
    generatorProfile->setHasOrOperator(falseValue);
    generatorProfile->setHasXorOperator(trueValue);
    generatorProfile->setHasNotOperator(falseValue);

    EXPECT_EQ(value, generatorProfile->equalityString());
    EXPECT_EQ(value, generatorProfile->eqString());
    EXPECT_EQ(value, generatorProfile->neqString());
    EXPECT_EQ(value, generatorProfile->ltString());
    EXPECT_EQ(value, generatorProfile->leqString());
    EXPECT_EQ(value, generatorProfile->gtString());
    EXPECT_EQ(value, generatorProfile->geqString());
    EXPECT_EQ(value, generatorProfile->andString());
    EXPECT_EQ(value, generatorProfile->orString());
    EXPECT_EQ(value, generatorProfile->xorString());
    EXPECT_EQ(value, generatorProfile->notString());

    EXPECT_EQ(falseValue, generatorProfile->hasEqOperator());
    EXPECT_EQ(falseValue, generatorProfile->hasNeqOperator());
    EXPECT_EQ(falseValue, generatorProfile->hasLtOperator());
    EXPECT_EQ(falseValue, generatorProfile->hasLeqOperator());
    EXPECT_EQ(falseValue, generatorProfile->hasGtOperator());
    EXPECT_EQ(falseValue, generatorProfile->hasGeqOperator());
    EXPECT_EQ(falseValue, generatorProfile->hasAndOperator());
    EXPECT_EQ(falseValue, generatorProfile->hasOrOperator());
    EXPECT_EQ(trueValue, generatorProfile->hasXorOperator());
    EXPECT_EQ(falseValue, generatorProfile->hasNotOperator());
}